

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

Test * __thiscall
testing::internal::ParameterizedTestFactory<UnsignedLong_Unsigned_Test>::CreateTest
          (ParameterizedTestFactory<UnsignedLong_Unsigned_Test> *this)

{
  Test *this_00;
  
  WithParamInterface<unsigned_long>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_002350e0;
  this_00[1]._vptr_Test = (_func_int **)&PTR__UnsignedLong_Unsigned_Test_00235120;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }